

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_ellswift_tests(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uchar *ell_b64;
  uchar *puVar7;
  secp256k1_gej *a;
  secp256k1_context *psVar8;
  secp256k1_context *psVar9;
  uint64_t *extraout_RDX;
  ulong uVar10;
  secp256k1_context *unaff_RBX;
  secp256k1_context *psVar11;
  long lVar12;
  secp256k1_context *ge;
  ulong uVar13;
  secp256k1_fe *a_00;
  secp256k1_context *psVar14;
  ulong uVar15;
  secp256k1_fe *psVar16;
  ulong uVar17;
  ellswift_xdh_test *r;
  code *r_00;
  secp256k1_fe *a_01;
  uint uVar18;
  secp256k1_pubkey *bytes;
  bool bVar19;
  secp256k1_fe sStackY_ee8;
  secp256k1_fe sStackY_eb8;
  secp256k1_context *psStackY_e80;
  secp256k1_fe *psStackY_e78;
  uint uStackY_e6c;
  secp256k1_context *psStackY_e68;
  secp256k1_fe sStackY_e60;
  secp256k1_fe sStackY_e30;
  secp256k1_fe sStackY_e00;
  secp256k1_fe sStackY_dd0;
  secp256k1_fe sStackY_da0;
  secp256k1_fe sStackY_d70;
  secp256k1_fe sStackY_d40;
  secp256k1_fe sStackY_d10;
  secp256k1_context *psStackY_cd8;
  secp256k1_context *psStackY_cd0;
  secp256k1_context *psStackY_cc8;
  secp256k1_context *psStackY_cc0;
  secp256k1_context *local_ca0;
  uchar share32_bad [32];
  uchar share32 [32];
  secp256k1_scalar sec;
  uchar sec32 [32];
  uint64_t local_c08;
  uchar sec32b_bad [32];
  uchar share32b [32];
  uchar share32a [32];
  secp256k1_scalar sec_1;
  uchar ell64_1 [64];
  uchar auxrnd32 [32];
  secp256k1_pubkey pubkey_1;
  uchar rnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  uchar ell64 [64];
  secp256k1_fe t;
  secp256k1_context local_758 [4];
  secp256k1_fe x2;
  
  psVar9 = (secp256k1_context *)ellswift_xswiftec_inv_tests[0].encs;
  lVar4 = 0;
  psVar11 = (secp256k1_context *)&t;
  do {
    psVar16 = &ellswift_xswiftec_inv_tests[lVar4].x;
    r = (ellswift_xdh_test *)&ellswift_xswiftec_inv_tests[lVar4].u;
    lVar12 = 0;
    r_00 = (code *)psVar9;
    do {
      ge = (secp256k1_context *)psVar16;
      psVar14 = psVar11;
      iVar2 = secp256k1_ellswift_xswiftec_inv_var
                        ((secp256k1_fe *)psVar11,psVar16,(secp256k1_fe *)r,(uint)lVar12);
      uVar6 = iVar2 - (uint)(((uint)ellswift_xswiftec_inv_tests[lVar4].enc_bitmap >>
                              ((uint)lVar12 & 0x1f) & 1) != 0);
      uVar5 = (ulong)uVar6;
      if (uVar6 != 0) {
        run_ellswift_tests_cold_1();
LAB_00123201:
        run_ellswift_tests_cold_3();
LAB_00123206:
        run_ellswift_tests_cold_2();
        goto LAB_0012320b;
      }
      if (iVar2 != 0) {
        ge = (secp256k1_context *)r_00;
        psVar14 = psVar11;
        iVar2 = fe_equal((secp256k1_fe *)psVar11,(secp256k1_fe *)r_00);
        uVar6 = (uint)uVar5;
        if (iVar2 == 0) goto LAB_00123201;
        unaff_RBX = (secp256k1_context *)&x2;
        secp256k1_ellswift_xswiftec_var
                  ((secp256k1_fe *)unaff_RBX,(secp256k1_fe *)r,(secp256k1_fe *)r_00);
        ge = unaff_RBX;
        psVar14 = (secp256k1_context *)psVar16;
        iVar2 = fe_equal(psVar16,(secp256k1_fe *)unaff_RBX);
        uVar6 = (uint)uVar5;
        if (iVar2 != 0) goto LAB_001225fd;
        goto LAB_00123206;
      }
LAB_001225fd:
      lVar12 = lVar12 + 1;
      r_00 = (code *)((((secp256k1_context *)r_00)->ecmult_gen_ctx).ge_offset.x.n + 1);
    } while (lVar12 != 8);
    lVar4 = lVar4 + 1;
    psVar9 = (secp256k1_context *)(psVar9[2].ecmult_gen_ctx.scalar_offset.d + 2);
  } while (lVar4 != 0x20);
  unaff_RBX = (secp256k1_context *)&ellswift_decode_tests[0].x;
  r_00 = (code *)0x4c;
  psVar11 = local_758;
  r = (ellswift_xdh_test *)&t;
  do {
    ge = (secp256k1_context *)&x2;
    psVar14 = CTX;
    iVar2 = secp256k1_ellswift_decode
                      (CTX,(secp256k1_pubkey *)&x2,
                       (uchar *)(unaff_RBX[-1].ecmult_gen_ctx.proj_blind.n + 3));
    uVar6 = (uint)uVar5;
    if (iVar2 == 0) goto LAB_0012320b;
    ge = (secp256k1_context *)r;
    psVar14 = CTX;
    iVar2 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)r,(secp256k1_pubkey *)&x2);
    uVar6 = (uint)uVar5;
    if (iVar2 == 0) goto LAB_00123210;
    ge = (secp256k1_context *)r;
    psVar14 = unaff_RBX;
    iVar2 = fe_equal((secp256k1_fe *)unaff_RBX,(secp256k1_fe *)r);
    uVar6 = (uint)uVar5;
    if (iVar2 == 0) goto LAB_00123215;
    psVar14 = psVar11;
    secp256k1_fe_verify((secp256k1_fe *)psVar11);
    uVar6 = (uint)uVar5;
    if (local_758[0].ecmult_gen_ctx.ge_offset.x.n[0]._4_4_ == 0) goto LAB_0012321a;
    if ((local_758[0].ecmult_gen_ctx.built & 1U) !=
        (uint)(unaff_RBX->ecmult_gen_ctx).ge_offset.x.n[1]) goto LAB_0012321f;
    unaff_RBX = (secp256k1_context *)((unaff_RBX->ecmult_gen_ctx).ge_offset.y.n + 4);
    r_00 = (code *)&((secp256k1_context *)((long)r_00 + -0xe8))->field_0xe7;
  } while (r_00 != (code *)0x0);
  psVar11 = (secp256k1_context *)ellswift_xdh_tests_bip324[0].shared_secret;
  lVar4 = 0;
  r = ellswift_xdh_tests_bip324;
  r_00 = ellswift_xdh_hash_function_bip324;
  unaff_RBX = (secp256k1_context *)&t;
  do {
    bVar19 = ellswift_xdh_tests_bip324[lVar4].initiating == 0;
    ell_b64 = ellswift_xdh_tests_bip324[lVar4].ellswift_theirs;
    puVar7 = ellswift_xdh_tests_bip324[lVar4].ellswift_ours;
    if (bVar19) {
      ell_b64 = ellswift_xdh_tests_bip324[lVar4].ellswift_ours;
      puVar7 = ellswift_xdh_tests_bip324[lVar4].ellswift_theirs;
    }
    psStackY_cc0 = (secp256k1_context *)0x122728;
    ge = unaff_RBX;
    psVar14 = CTX;
    iVar2 = secp256k1_ellswift_xdh
                      (CTX,(uchar *)unaff_RBX,puVar7,ell_b64,
                       ellswift_xdh_tests_bip324[lVar4].priv_ours,(uint)bVar19,
                       ellswift_xdh_hash_function_bip324,(void *)0x0);
    uVar6 = (uint)ell_b64;
    if (iVar2 == 0) goto LAB_00123224;
    lVar12 = 0;
    do {
      cVar1 = *(char *)((long)t.n + lVar12);
      ell_b64 = (uchar *)CONCAT71((int7)((ulong)ell_b64 >> 8),cVar1);
      uVar6 = (uint)ell_b64;
      local_ca0 = unaff_RBX;
      psVar9 = (secp256k1_context *)r_00;
      if (cVar1 != *(char *)((long)(psVar11->ecmult_gen_ctx).scalar_offset.d + lVar12 + -8))
      goto LAB_0012327e;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    lVar4 = lVar4 + 1;
    psVar11 = (secp256k1_context *)((long)&(psVar11->illegal_callback).fn + 4);
  } while (lVar4 != 7);
  if (0 < COUNT) {
    iVar2 = 0;
    r_00 = (code *)ell64;
    r = (ellswift_xdh_test *)&pubkey2;
    do {
      unaff_RBX = (secp256k1_context *)&t;
      testutil_random_ge_test((secp256k1_ge *)unaff_RBX);
      secp256k1_ge_to_bytes(pubkey_1.data,(secp256k1_ge *)unaff_RBX);
      testrand256(rnd32);
      puVar7 = rnd32;
      secp256k1_ellswift_encode(CTX,(uchar *)r_00,&pubkey_1,rnd32);
      uVar6 = (uint)puVar7;
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)r,(uchar *)r_00);
      psVar11 = (secp256k1_context *)&x2;
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)psVar11,(secp256k1_pubkey *)r);
      ge = psVar11;
      psVar14 = unaff_RBX;
      iVar3 = secp256k1_ge_eq_var((secp256k1_ge *)unaff_RBX,(secp256k1_ge *)psVar11);
      if (iVar3 == 0) goto LAB_00123229;
      iVar2 = iVar2 + 1;
    } while (SBORROW4(iVar2,COUNT * 1000) != iVar2 + COUNT * -1000 < 0);
    if (0 < COUNT) {
      uVar18 = 0;
      unaff_RBX = (secp256k1_context *)&sec;
      psVar11 = (secp256k1_context *)ell64_1;
      r_00 = (code *)&pubkey_1;
      do {
        if ((uVar18 & 1) == 0) {
          puVar7 = (uchar *)0x0;
        }
        else {
          puVar7 = auxrnd32;
          testrand_bytes_test(puVar7,0x20);
        }
        testutil_random_scalar_order_test((secp256k1_scalar *)unaff_RBX);
        r = (ellswift_xdh_test *)sec32;
        secp256k1_scalar_get_b32((uchar *)r,(secp256k1_scalar *)unaff_RBX);
        ge = psVar11;
        psVar14 = CTX;
        iVar2 = secp256k1_ellswift_create(CTX,(uchar *)psVar11,(uchar *)r,puVar7);
        uVar6 = (uint)puVar7;
        if (iVar2 == 0) goto LAB_0012322e;
        r = (ellswift_xdh_test *)rnd32;
        secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)r,(uchar *)psVar11);
        ge = (secp256k1_context *)&pubkey2;
        secp256k1_pubkey_load(CTX,(secp256k1_ge *)ge,(secp256k1_pubkey *)r);
        share32._0_8_ = ell64;
        share32._8_8_ = &x2;
        share32._16_8_ = &t;
        uVar6 = 0;
        secp256k1_ecmult_strauss_wnaf
                  ((secp256k1_strauss_state *)share32,(secp256k1_gej *)r_00,1,(secp256k1_gej *)0x0,
                   &secp256k1_scalar_zero,(secp256k1_scalar *)unaff_RBX);
        psVar14 = (secp256k1_context *)r_00;
        iVar2 = secp256k1_gej_eq_ge_var((secp256k1_gej *)r_00,(secp256k1_ge *)ge);
        if (iVar2 == 0) goto LAB_00123233;
        uVar18 = uVar18 + 1;
      } while (SBORROW4(uVar18,COUNT * 400) != (int)(uVar18 + COUNT * -400) < 0);
      if (0 < COUNT) {
        uVar18 = 0;
        unaff_RBX = (secp256k1_context *)&sec_1;
        r_00 = (code *)sec32;
        do {
          testutil_random_scalar_order_test((secp256k1_scalar *)unaff_RBX);
          secp256k1_scalar_get_b32((uchar *)&sec,(secp256k1_scalar *)unaff_RBX);
          psVar11 = (secp256k1_context *)ell64_1;
          testrand_bytes_test((uchar *)psVar11,0x20);
          testrand_bytes_test(ell64_1 + 0x20,0x20);
          secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)auxrnd32,(uchar *)psVar11);
          secp256k1_pubkey_load(CTX,(secp256k1_ge *)rnd32,(secp256k1_pubkey *)auxrnd32);
          secp256k1_gej_set_ge((secp256k1_gej *)&pubkey_1,(secp256k1_ge *)rnd32);
          r = (ellswift_xdh_test *)share32;
          psStackY_cc0 = (secp256k1_context *)0x122a05;
          psVar9 = psVar11;
          ge = (secp256k1_context *)r;
          psVar14 = CTX;
          iVar2 = secp256k1_ellswift_xdh
                            (CTX,(uchar *)r,(uchar *)psVar11,(uchar *)psVar11,(uchar *)&sec,
                             uVar18 & 1,ellswift_xdh_hash_x32,(void *)0x0);
          uVar6 = (uint)psVar9;
          if (iVar2 == 0) goto LAB_00123238;
          secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r_00,(uchar *)r);
          if ((((ulong)sec32._0_8_ < 0xffffefffffc2f) || (local_c08 != 0xffffffffffff)) ||
             ((sec32._16_8_ & sec32._24_8_ & sec32._8_8_) != 0xfffffffffffff)) {
            secp256k1_fe_verify((secp256k1_fe *)r_00);
          }
          secp256k1_fe_verify((secp256k1_fe *)r_00);
          sec32b_bad._0_8_ = ell64;
          sec32b_bad._8_8_ = &x2;
          psVar11 = (secp256k1_context *)&t;
          r = (ellswift_xdh_test *)&pubkey2;
          a = (secp256k1_gej *)&pubkey_1;
          sec32b_bad._16_8_ = psVar11;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)sec32b_bad,(secp256k1_gej *)r,1,a,
                     (secp256k1_scalar *)unaff_RBX,(secp256k1_scalar *)0x0);
          uVar6 = (uint)a;
          secp256k1_ge_set_gej((secp256k1_ge *)psVar11,(secp256k1_gej *)r);
          ge = (secp256k1_context *)r_00;
          psVar14 = psVar11;
          iVar2 = fe_equal((secp256k1_fe *)psVar11,(secp256k1_fe *)r_00);
          if (iVar2 == 0) goto LAB_0012323d;
          uVar18 = uVar18 + 1;
        } while (SBORROW4(uVar18,COUNT * 800) != (int)(uVar18 + COUNT * -800) < 0);
        if (0 < COUNT) {
          uVar5 = 0;
          do {
            iVar2 = (int)uVar5 + (int)(uVar5 / 3) * -3;
            if (iVar2 == 0) {
              local_ca0 = (secp256k1_context *)ellswift_xdh_hash_x32;
LAB_00122b71:
              bytes = (secp256k1_pubkey *)0x0;
            }
            else {
              if (iVar2 == 1) {
                local_ca0 = (secp256k1_context *)ellswift_xdh_hash_function_bip324;
                goto LAB_00122b71;
              }
              bytes = &pubkey2;
              testrand_bytes_test(bytes->data,0x20);
              testrand_bytes_test(pubkey2.data + 0x20,0x20);
              local_ca0 = (secp256k1_context *)ellswift_xdh_hash_function_prefix;
            }
            r = (ellswift_xdh_test *)rnd32;
            testrand_bytes_test((uchar *)r,0x20);
            r_00 = (code *)ell64_1;
            testrand_bytes_test((uchar *)r_00,0x20);
            testutil_random_scalar_order_test(&seca);
            testutil_random_scalar_order(&secb);
            unaff_RBX = (secp256k1_context *)&sec;
            secp256k1_scalar_get_b32((uchar *)unaff_RBX,&seca);
            secp256k1_scalar_get_b32(share32,&secb);
            psVar11 = (secp256k1_context *)&t;
            psVar9 = (secp256k1_context *)r;
            ge = psVar11;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_create(CTX,(uchar *)psVar11,(uchar *)unaff_RBX,(uchar *)r);
            uVar6 = (uint)psVar9;
            if (iVar3 == 0) goto LAB_00123242;
            r = (ellswift_xdh_test *)&x2;
            psVar9 = (secp256k1_context *)r_00;
            ge = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_create(CTX,(uchar *)r,share32,(uchar *)r_00);
            uVar6 = (uint)psVar9;
            if (iVar3 == 0) goto LAB_00123247;
            ge = (secp256k1_context *)share32a;
            psStackY_cc0 = (secp256k1_context *)0x122c8c;
            psVar9 = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,(uchar *)&sec,0,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            uVar6 = (uint)psVar9;
            if (iVar3 == 0) goto LAB_0012324c;
            ge = (secp256k1_context *)share32b;
            psStackY_cc0 = (secp256k1_context *)0x122cbe;
            psVar8 = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,share32,1,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            uVar6 = (uint)psVar8;
            if (iVar3 == 0) goto LAB_00123251;
            lVar4 = 0;
            psVar9 = (secp256k1_context *)&pubkey_1;
            do {
              psVar8 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar8 >> 8),share32a[lVar4]);
              uVar6 = (uint)psVar8;
              if (share32a[lVar4] != share32b[lVar4]) goto LAB_00123283;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0x20);
            pubkey_1.data[0x20] = (undefined1)x2.n[4];
            pubkey_1.data[0x21] = x2.n[4]._1_1_;
            pubkey_1.data[0x22] = x2.n[4]._2_1_;
            pubkey_1.data[0x23] = x2.n[4]._3_1_;
            pubkey_1.data[0x24] = x2.n[4]._4_1_;
            pubkey_1.data[0x25] = x2.n[4]._5_1_;
            pubkey_1.data[0x26] = x2.n[4]._6_1_;
            pubkey_1.data[0x27] = x2.n[4]._7_1_;
            pubkey_1.data._40_8_ = x2._40_8_;
            pubkey_1.data[0x10] = (undefined1)x2.n[2];
            pubkey_1.data[0x11] = x2.n[2]._1_1_;
            pubkey_1.data[0x12] = x2.n[2]._2_1_;
            pubkey_1.data[0x13] = x2.n[2]._3_1_;
            pubkey_1.data[0x14] = x2.n[2]._4_1_;
            pubkey_1.data[0x15] = x2.n[2]._5_1_;
            pubkey_1.data[0x16] = x2.n[2]._6_1_;
            pubkey_1.data[0x17] = x2.n[2]._7_1_;
            pubkey_1.data[0x18] = (undefined1)x2.n[3];
            pubkey_1.data[0x19] = x2.n[3]._1_1_;
            pubkey_1.data[0x1a] = x2.n[3]._2_1_;
            pubkey_1.data[0x1b] = x2.n[3]._3_1_;
            pubkey_1.data[0x1c] = x2.n[3]._4_1_;
            pubkey_1.data[0x1d] = x2.n[3]._5_1_;
            pubkey_1.data[0x1e] = x2.n[3]._6_1_;
            pubkey_1.data[0x1f] = x2.n[3]._7_1_;
            pubkey_1.data[0] = (undefined1)x2.n[0];
            pubkey_1.data[1] = x2.n[0]._1_1_;
            pubkey_1.data[2] = x2.n[0]._2_1_;
            pubkey_1.data[3] = x2.n[0]._3_1_;
            pubkey_1.data[4] = x2.n[0]._4_1_;
            pubkey_1.data[5] = x2.n[0]._5_1_;
            pubkey_1.data[6] = x2.n[0]._6_1_;
            pubkey_1.data[7] = x2.n[0]._7_1_;
            pubkey_1.data[8] = (undefined1)x2.n[1];
            pubkey_1.data[9] = x2.n[1]._1_1_;
            pubkey_1.data[10] = x2.n[1]._2_1_;
            pubkey_1.data[0xb] = x2.n[1]._3_1_;
            pubkey_1.data[0xc] = x2.n[1]._4_1_;
            pubkey_1.data[0xd] = x2.n[1]._5_1_;
            pubkey_1.data[0xe] = x2.n[1]._6_1_;
            pubkey_1.data[0xf] = x2.n[1]._7_1_;
            testrand_flip((uchar *)psVar9,0x40);
            ge = (secp256k1_context *)share32_bad;
            psStackY_cc0 = (secp256k1_context *)0x122d60;
            psVar8 = psVar9;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)psVar9,(uchar *)&sec,0,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            uVar6 = (uint)psVar8;
            r_00 = (code *)psVar9;
            if (iVar3 == 0) goto LAB_00123256;
            lVar4 = 0;
            while( true ) {
              psVar8 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar8 >> 8),share32_bad[lVar4]);
              uVar6 = (uint)psVar8;
              if (share32_bad[lVar4] != share32a[lVar4]) break;
              lVar4 = lVar4 + 1;
              if (lVar4 == 0x20) goto LAB_00123288;
            }
            ell64[0x38] = (undefined1)local_758[0].ecmult_gen_ctx.scalar_offset.d[0];
            ell64[0x39] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._1_1_;
            ell64[0x3a] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._2_1_;
            ell64[0x3b] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._3_1_;
            ell64[0x3c] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._4_1_;
            ell64[0x3d] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._5_1_;
            ell64[0x3e] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._6_1_;
            ell64[0x3f] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._7_1_;
            ell64[0x20] = (undefined1)t.n[4];
            ell64[0x21] = t.n[4]._1_1_;
            ell64[0x22] = t.n[4]._2_1_;
            ell64[0x23] = t.n[4]._3_1_;
            ell64[0x24] = t.n[4]._4_1_;
            ell64[0x25] = t.n[4]._5_1_;
            ell64[0x26] = t.n[4]._6_1_;
            ell64[0x27] = t.n[4]._7_1_;
            ell64._40_8_ = t._40_8_;
            ell64[0x10] = (undefined1)t.n[2];
            ell64[0x11] = t.n[2]._1_1_;
            ell64[0x12] = t.n[2]._2_1_;
            ell64[0x13] = t.n[2]._3_1_;
            ell64[0x14] = t.n[2]._4_1_;
            ell64[0x15] = t.n[2]._5_1_;
            ell64[0x16] = t.n[2]._6_1_;
            ell64[0x17] = t.n[2]._7_1_;
            ell64[0x18] = (undefined1)t.n[3];
            ell64[0x19] = t.n[3]._1_1_;
            ell64[0x1a] = t.n[3]._2_1_;
            ell64[0x1b] = t.n[3]._3_1_;
            ell64[0x1c] = t.n[3]._4_1_;
            ell64[0x1d] = t.n[3]._5_1_;
            ell64[0x1e] = t.n[3]._6_1_;
            ell64[0x1f] = t.n[3]._7_1_;
            ell64[0] = (undefined1)t.n[0];
            ell64[1] = t.n[0]._1_1_;
            ell64[2] = t.n[0]._2_1_;
            ell64[3] = t.n[0]._3_1_;
            ell64[4] = t.n[0]._4_1_;
            ell64[5] = t.n[0]._5_1_;
            ell64[6] = t.n[0]._6_1_;
            ell64[7] = t.n[0]._7_1_;
            ell64[8] = (undefined1)t.n[1];
            ell64[9] = t.n[1]._1_1_;
            ell64[10] = t.n[1]._2_1_;
            ell64[0xb] = t.n[1]._3_1_;
            ell64[0xc] = t.n[1]._4_1_;
            ell64[0xd] = t.n[1]._5_1_;
            ell64[0xe] = t.n[1]._6_1_;
            ell64[0xf] = t.n[1]._7_1_;
            r_00 = (code *)ell64;
            testrand_flip((uchar *)r_00,0x40);
            ge = (secp256k1_context *)share32_bad;
            psStackY_cc0 = (secp256k1_context *)0x122e06;
            psVar8 = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)r_00,(uchar *)r,share32,1,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            uVar6 = (uint)psVar8;
            if (iVar3 == 0) goto LAB_0012325b;
            lVar4 = 0;
            while( true ) {
              psVar8 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar8 >> 8),share32_bad[lVar4]);
              uVar6 = (uint)psVar8;
              if (share32_bad[lVar4] != share32b[lVar4]) break;
              lVar4 = lVar4 + 1;
              if (lVar4 == 0x20) goto LAB_0012328d;
            }
            sec_1.d[2] = sec.d[2];
            sec_1.d[3] = sec.d[3];
            sec_1.d[0] = sec.d[0];
            sec_1.d[1] = sec.d[1];
            r_00 = (code *)&sec_1;
            testrand_flip((uchar *)r_00,0x20);
            ge = (secp256k1_context *)share32_bad;
            psStackY_cc0 = (secp256k1_context *)0x122e7e;
            psVar8 = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,(uchar *)r_00,0,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            if (iVar3 != 0) {
              lVar4 = 0;
              while( true ) {
                psVar8 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar8 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar8;
                if (share32_bad[lVar4] != share32a[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_00123292;
              }
            }
            sec32b_bad[0x10] = share32[0x10];
            sec32b_bad[0x11] = share32[0x11];
            sec32b_bad[0x12] = share32[0x12];
            sec32b_bad[0x13] = share32[0x13];
            sec32b_bad[0x14] = share32[0x14];
            sec32b_bad[0x15] = share32[0x15];
            sec32b_bad[0x16] = share32[0x16];
            sec32b_bad[0x17] = share32[0x17];
            sec32b_bad[0x18] = share32[0x18];
            sec32b_bad[0x19] = share32[0x19];
            sec32b_bad[0x1a] = share32[0x1a];
            sec32b_bad[0x1b] = share32[0x1b];
            sec32b_bad[0x1c] = share32[0x1c];
            sec32b_bad[0x1d] = share32[0x1d];
            sec32b_bad[0x1e] = share32[0x1e];
            sec32b_bad[0x1f] = share32[0x1f];
            sec32b_bad[0] = share32[0];
            sec32b_bad[1] = share32[1];
            sec32b_bad[2] = share32[2];
            sec32b_bad[3] = share32[3];
            sec32b_bad[4] = share32[4];
            sec32b_bad[5] = share32[5];
            sec32b_bad[6] = share32[6];
            sec32b_bad[7] = share32[7];
            sec32b_bad[8] = share32[8];
            sec32b_bad[9] = share32[9];
            sec32b_bad[10] = share32[10];
            sec32b_bad[0xb] = share32[0xb];
            sec32b_bad[0xc] = share32[0xc];
            sec32b_bad[0xd] = share32[0xd];
            sec32b_bad[0xe] = share32[0xe];
            sec32b_bad[0xf] = share32[0xf];
            r_00 = (code *)sec32b_bad;
            testrand_flip((uchar *)r_00,0x20);
            ge = (secp256k1_context *)share32_bad;
            psStackY_cc0 = (secp256k1_context *)0x122ef5;
            psVar8 = (secp256k1_context *)r;
            psVar14 = CTX;
            iVar3 = secp256k1_ellswift_xdh
                              (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,(uchar *)r_00,1,
                               (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
            if (iVar3 != 0) {
              lVar4 = 0;
              while( true ) {
                psVar8 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar8 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar8;
                if (share32_bad[lVar4] != share32b[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_00123297;
              }
            }
            if (iVar2 != 0) {
              sec32[0x10] = ell64_1[0x10];
              sec32[0x11] = ell64_1[0x11];
              sec32[0x12] = ell64_1[0x12];
              sec32[0x13] = ell64_1[0x13];
              sec32[0x14] = ell64_1[0x14];
              sec32[0x15] = ell64_1[0x15];
              sec32[0x16] = ell64_1[0x16];
              sec32[0x17] = ell64_1[0x17];
              sec32[0x18] = ell64_1[0x18];
              sec32[0x19] = ell64_1[0x19];
              sec32[0x1a] = ell64_1[0x1a];
              sec32[0x1b] = ell64_1[0x1b];
              sec32[0x1c] = ell64_1[0x1c];
              sec32[0x1d] = ell64_1[0x1d];
              sec32[0x1e] = ell64_1[0x1e];
              sec32[0x1f] = ell64_1[0x1f];
              sec32[0] = ell64_1[0];
              sec32[1] = ell64_1[1];
              sec32[2] = ell64_1[2];
              sec32[3] = ell64_1[3];
              sec32[4] = ell64_1[4];
              sec32[5] = ell64_1[5];
              sec32[6] = ell64_1[6];
              sec32[7] = ell64_1[7];
              sec32[8] = ell64_1[8];
              sec32[9] = ell64_1[9];
              sec32[10] = ell64_1[10];
              sec32[0xb] = ell64_1[0xb];
              sec32[0xc] = ell64_1[0xc];
              sec32[0xd] = ell64_1[0xd];
              sec32[0xe] = ell64_1[0xe];
              sec32[0xf] = ell64_1[0xf];
              r_00 = (code *)sec32;
              testrand_flip((uchar *)r_00,0x20);
              psVar8 = (secp256k1_context *)r_00;
              ge = psVar9;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_create(CTX,(uchar *)psVar9,share32,(uchar *)r_00);
              uVar6 = (uint)psVar8;
              if (iVar2 == 0) goto LAB_00123260;
              ge = (secp256k1_context *)share32_bad;
              psStackY_cc0 = (secp256k1_context *)0x122f9b;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_xdh
                                (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)psVar9,(uchar *)&sec,0,
                                 (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
              uVar6 = (uint)psVar9;
              if (iVar2 == 0) goto LAB_00123265;
              lVar4 = 0;
              r_00 = (code *)ell64;
              while( true ) {
                psVar9 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar9 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar9;
                if (share32_bad[lVar4] != share32a[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_0012329c;
              }
              auxrnd32[0x10] = rnd32[0x10];
              auxrnd32[0x11] = rnd32[0x11];
              auxrnd32[0x12] = rnd32[0x12];
              auxrnd32[0x13] = rnd32[0x13];
              auxrnd32[0x14] = rnd32[0x14];
              auxrnd32[0x15] = rnd32[0x15];
              auxrnd32[0x16] = rnd32[0x16];
              auxrnd32[0x17] = rnd32[0x17];
              auxrnd32[0x18] = rnd32[0x18];
              auxrnd32[0x19] = rnd32[0x19];
              auxrnd32[0x1a] = rnd32[0x1a];
              auxrnd32[0x1b] = rnd32[0x1b];
              auxrnd32[0x1c] = rnd32[0x1c];
              auxrnd32[0x1d] = rnd32[0x1d];
              auxrnd32[0x1e] = rnd32[0x1e];
              auxrnd32[0x1f] = rnd32[0x1f];
              auxrnd32[0] = rnd32[0];
              auxrnd32[1] = rnd32[1];
              auxrnd32[2] = rnd32[2];
              auxrnd32[3] = rnd32[3];
              auxrnd32[4] = rnd32[4];
              auxrnd32[5] = rnd32[5];
              auxrnd32[6] = rnd32[6];
              auxrnd32[7] = rnd32[7];
              auxrnd32[8] = rnd32[8];
              auxrnd32[9] = rnd32[9];
              auxrnd32[10] = rnd32[10];
              auxrnd32[0xb] = rnd32[0xb];
              auxrnd32[0xc] = rnd32[0xc];
              auxrnd32[0xd] = rnd32[0xd];
              auxrnd32[0xe] = rnd32[0xe];
              auxrnd32[0xf] = rnd32[0xf];
              testrand_flip(auxrnd32,0x20);
              psVar9 = (secp256k1_context *)auxrnd32;
              ge = (secp256k1_context *)r_00;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_create(CTX,(uchar *)r_00,(uchar *)&sec,auxrnd32);
              uVar6 = (uint)psVar9;
              psVar9 = (secp256k1_context *)auxrnd32;
              if (iVar2 == 0) goto LAB_0012326a;
              ge = (secp256k1_context *)share32_bad;
              psStackY_cc0 = (secp256k1_context *)0x12304d;
              psVar9 = (secp256k1_context *)r;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_xdh
                                (CTX,(uchar *)ge,(uchar *)r_00,(uchar *)r,share32,1,
                                 (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
              uVar6 = (uint)psVar9;
              if (iVar2 == 0) goto LAB_0012326f;
              lVar4 = 0;
              while( true ) {
                psVar9 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar9 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar9;
                if (share32_bad[lVar4] != share32b[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_001232a1;
              }
              ge = (secp256k1_context *)share32_bad;
              psStackY_cc0 = (secp256k1_context *)0x12309b;
              psVar9 = (secp256k1_context *)r;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_xdh
                                (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,(uchar *)&sec,1,
                                 (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
              uVar6 = (uint)psVar9;
              if (iVar2 == 0) goto LAB_00123274;
              lVar4 = 0;
              while( true ) {
                psVar9 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar9 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar9;
                if (share32_bad[lVar4] != share32a[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_001232a6;
              }
              ge = (secp256k1_context *)share32_bad;
              psStackY_cc0 = (secp256k1_context *)0x1230e4;
              psVar9 = (secp256k1_context *)r;
              psVar14 = CTX;
              iVar2 = secp256k1_ellswift_xdh
                                (CTX,(uchar *)ge,(uchar *)psVar11,(uchar *)r,share32,0,
                                 (secp256k1_ellswift_xdh_hash_function)local_ca0,bytes);
              uVar6 = (uint)psVar9;
              if (iVar2 == 0) goto LAB_00123279;
              lVar4 = 0;
              while( true ) {
                psVar9 = (secp256k1_context *)
                         CONCAT71((int7)((ulong)psVar9 >> 8),share32_bad[lVar4]);
                uVar6 = (uint)psVar9;
                if (share32_bad[lVar4] != share32b[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 0x20) goto LAB_001232ab;
              }
            }
            uVar6 = (int)uVar5 + 1;
            uVar5 = (ulong)uVar6;
          } while (SBORROW4(uVar6,COUNT * 200) != (int)(uVar6 + COUNT * -200) < 0);
        }
      }
    }
  }
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_encode",0x19);
  x2.n[0] = 0x28594b3d1a6524b;
  x2.n[1] = 0x1037a17796e42f4e;
  x2.n[2] = 0x560238851b8fcb8b;
  x2.n[3] = 0xd626b7152560ede1;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_create",0x19);
  x2.n[0] = 0xf7025f42d29e1bf5;
  x2.n[1] = 0x94cb7d59b024773;
  x2.n[2] = 0x3bc9786e59ed789;
  x2.n[3] = 0x4e363b5368335b35;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"bip324_ellswift_xonly_ecdh",0x1a);
  x2.n[0] = 0x827bd3928c12d730;
  x2.n[1] = 0x207b373e9e4fb2ee;
  x2.n[2] = 0xaa5441bc2292bd7a;
  x2.n[3] = 0xcfb5254915c3779f;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  return;
LAB_0012320b:
  run_ellswift_tests_cold_36();
LAB_00123210:
  run_ellswift_tests_cold_35();
LAB_00123215:
  run_ellswift_tests_cold_34();
LAB_0012321a:
  run_ellswift_tests_cold_33();
LAB_0012321f:
  run_ellswift_tests_cold_4();
LAB_00123224:
  run_ellswift_tests_cold_32();
LAB_00123229:
  run_ellswift_tests_cold_31();
LAB_0012322e:
  run_ellswift_tests_cold_30();
LAB_00123233:
  run_ellswift_tests_cold_29();
LAB_00123238:
  run_ellswift_tests_cold_28();
LAB_0012323d:
  run_ellswift_tests_cold_27();
LAB_00123242:
  run_ellswift_tests_cold_26();
LAB_00123247:
  local_ca0 = unaff_RBX;
  run_ellswift_tests_cold_25();
LAB_0012324c:
  run_ellswift_tests_cold_24();
LAB_00123251:
  run_ellswift_tests_cold_23();
LAB_00123256:
  run_ellswift_tests_cold_22();
LAB_0012325b:
  run_ellswift_tests_cold_20();
LAB_00123260:
  run_ellswift_tests_cold_18();
LAB_00123265:
  run_ellswift_tests_cold_17();
  psVar9 = local_ca0;
LAB_0012326a:
  local_ca0 = psVar9;
  run_ellswift_tests_cold_15();
LAB_0012326f:
  run_ellswift_tests_cold_14();
LAB_00123274:
  run_ellswift_tests_cold_12();
LAB_00123279:
  run_ellswift_tests_cold_10();
  psVar9 = (secp256k1_context *)r_00;
LAB_0012327e:
  run_ellswift_tests_cold_5();
LAB_00123283:
  run_ellswift_tests_cold_6();
  r_00 = (code *)psVar9;
LAB_00123288:
  run_ellswift_tests_cold_21();
LAB_0012328d:
  run_ellswift_tests_cold_19();
LAB_00123292:
  run_ellswift_tests_cold_7();
LAB_00123297:
  run_ellswift_tests_cold_8();
LAB_0012329c:
  run_ellswift_tests_cold_16();
LAB_001232a1:
  run_ellswift_tests_cold_13();
LAB_001232a6:
  run_ellswift_tests_cold_11();
LAB_001232ab:
  run_ellswift_tests_cold_9();
  psStackY_cc0 = psVar11;
  psStackY_cc8 = (secp256k1_context *)r_00;
  psStackY_cd0 = (secp256k1_context *)r;
  psStackY_cd8 = local_ca0;
  sStackY_e00.n[0] = *(uint64_t *)&ge->ecmult_gen_ctx;
  sStackY_e00.n[1] = (ge->ecmult_gen_ctx).scalar_offset.d[0];
  sStackY_e00.n[2] = (ge->ecmult_gen_ctx).scalar_offset.d[1];
  sStackY_e00.n[3] = (ge->ecmult_gen_ctx).scalar_offset.d[2];
  sStackY_e00.n[4] = (ge->ecmult_gen_ctx).scalar_offset.d[3];
  sStackY_e00._40_8_ = (ge->ecmult_gen_ctx).ge_offset.x.n[0];
  sStackY_dd0.n[0] = *extraout_RDX;
  sStackY_dd0.n[1] = extraout_RDX[1];
  sStackY_dd0.n[2] = extraout_RDX[2];
  sStackY_dd0.n[3] = extraout_RDX[3];
  sStackY_dd0.n[4] = extraout_RDX[4];
  sStackY_dd0._40_8_ = extraout_RDX[5];
  a_01 = &sStackY_dd0;
  psStackY_e78 = (secp256k1_fe *)0x12332f;
  uStackY_e6c = uVar6;
  psStackY_e68 = psVar14;
  secp256k1_fe_verify(&sStackY_e00);
  uVar5 = (sStackY_e00.n[4] >> 0x30) * 0x1000003d1 + sStackY_e00.n[0];
  uVar10 = (uVar5 >> 0x34) + sStackY_e00.n[1];
  uVar13 = (uVar10 >> 0x34) + sStackY_e00.n[2];
  uVar15 = (uVar13 >> 0x34) + sStackY_e00.n[3];
  sStackY_e00.n[3] = uVar15 & 0xfffffffffffff;
  sStackY_e00.n[4] = (uVar15 >> 0x34) + (sStackY_e00.n[4] & 0xffffffffffff);
  sStackY_e00.n[2] = uVar13 & 0xfffffffffffff;
  sStackY_e00.n[1] = uVar10 & 0xfffffffffffff;
  sStackY_e00.n[0] = uVar5 & 0xfffffffffffff;
  psVar11 = (secp256k1_context *)0x1;
  sStackY_e00.magnitude = 1;
  psStackY_e78 = (secp256k1_fe *)0x12339f;
  secp256k1_fe_verify(&sStackY_e00);
  psStackY_e78 = (secp256k1_fe *)0x1233a7;
  secp256k1_fe_verify(a_01);
  uVar6 = uStackY_e6c;
  uVar5 = (sStackY_dd0.n[4] >> 0x30) * 0x1000003d1 + sStackY_dd0.n[0];
  uVar10 = (uVar5 >> 0x34) + sStackY_dd0.n[1];
  uVar13 = (uVar10 >> 0x34) + sStackY_dd0.n[2];
  uVar15 = (uVar13 >> 0x34) + sStackY_dd0.n[3];
  sStackY_dd0.n[3] = uVar15 & 0xfffffffffffff;
  sStackY_dd0.n[4] = (uVar15 >> 0x34) + (sStackY_dd0.n[4] & 0xffffffffffff);
  a_00 = (secp256k1_fe *)(uVar13 & 0xfffffffffffff);
  sStackY_dd0.n[1] = uVar10 & 0xfffffffffffff;
  sStackY_dd0.n[0] = uVar5 & 0xfffffffffffff;
  sStackY_dd0.magnitude = 1;
  psStackY_e78 = (secp256k1_fe *)0x123417;
  psVar16 = a_01;
  sStackY_dd0.n[2] = (uint64_t)a_00;
  secp256k1_fe_verify(a_01);
  if ((int)uVar6 < 0) {
    psStackY_e78 = (secp256k1_fe *)0x123e96;
    secp256k1_ellswift_xswiftec_inv_var_cold_13();
LAB_00123e96:
    psStackY_e78 = (secp256k1_fe *)0x123e9b;
    secp256k1_ellswift_xswiftec_inv_var_cold_12();
LAB_00123e9b:
    psStackY_e78 = (secp256k1_fe *)0x123ea0;
    secp256k1_ellswift_xswiftec_inv_var_cold_11();
LAB_00123ea0:
    psStackY_e78 = (secp256k1_fe *)0x123ea5;
    secp256k1_ellswift_xswiftec_inv_var_cold_6();
LAB_00123ea5:
    psStackY_e78 = (secp256k1_fe *)0x123eaa;
    secp256k1_ellswift_xswiftec_inv_var_cold_5();
LAB_00123eaa:
    psStackY_e78 = (secp256k1_fe *)0x123eaf;
    secp256k1_ellswift_xswiftec_inv_var_cold_4();
LAB_00123eaf:
    psStackY_e78 = (secp256k1_fe *)0x123eb4;
    secp256k1_ellswift_xswiftec_inv_var_cold_3();
LAB_00123eb4:
    psStackY_e78 = (secp256k1_fe *)0x123eb9;
    secp256k1_ellswift_xswiftec_inv_var_cold_9();
LAB_00123eb9:
    psStackY_e78 = (secp256k1_fe *)0x123ebe;
    secp256k1_ellswift_xswiftec_inv_var_cold_8();
LAB_00123ebe:
    psStackY_e78 = (secp256k1_fe *)0x123ec3;
    secp256k1_ellswift_xswiftec_inv_var_cold_2();
LAB_00123ec3:
    psStackY_e78 = (secp256k1_fe *)0x123ec8;
    secp256k1_ellswift_xswiftec_inv_var_cold_1();
  }
  else {
    psVar16 = &sStackY_e00;
    psStackY_e78 = (secp256k1_fe *)0x12342a;
    iVar2 = secp256k1_ge_x_on_curve_var(psVar16);
    if (iVar2 == 0) goto LAB_00123e96;
    if ((uVar6 & 2) != 0) {
      psVar11 = (secp256k1_context *)0x3fffffffffffc;
      psStackY_e78 = (secp256k1_fe *)0x1237d9;
      secp256k1_fe_verify(&sStackY_dd0);
      a_00 = (secp256k1_fe *)0x1;
      psStackY_e78 = (secp256k1_fe *)0x1237e6;
      secp256k1_fe_verify_magnitude(&sStackY_dd0,1);
      sStackY_e30.n[0] = 0x3ffffbfffff0bc - sStackY_dd0.n[0];
      sStackY_e30.n[1] = 0x3ffffffffffffc - sStackY_dd0.n[1];
      sStackY_e30.n[2] = 0x3ffffffffffffc - sStackY_dd0.n[2];
      sStackY_e30.n[3] = 0x3ffffffffffffc - sStackY_dd0.n[3];
      sStackY_e30.n[4] = 0x3fffffffffffc - sStackY_dd0.n[4];
      sStackY_e30.magnitude = 2;
      sStackY_e30.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x12382c;
      secp256k1_fe_verify(&sStackY_e30);
      a_01 = &sStackY_e60;
      sStackY_e60.n[4] = sStackY_e30.n[4];
      sStackY_e60.magnitude = sStackY_e30.magnitude;
      sStackY_e60.normalized = sStackY_e30.normalized;
      sStackY_e60.n[2] = sStackY_e30.n[2];
      sStackY_e60.n[3] = sStackY_e30.n[3];
      sStackY_e60.n[0] = sStackY_e30.n[0];
      sStackY_e60.n[1] = sStackY_e30.n[1];
      psStackY_e78 = (secp256k1_fe *)0x123855;
      secp256k1_fe_verify(a_01);
      psVar16 = &sStackY_e00;
      psStackY_e78 = (secp256k1_fe *)0x123862;
      secp256k1_fe_verify(psVar16);
      if (0x20 < sStackY_e00.magnitude + sStackY_e60.magnitude) goto LAB_00123ea0;
      sStackY_e60.n[0] = sStackY_e60.n[0] + sStackY_e00.n[0];
      sStackY_e60.n[1] = sStackY_e60.n[1] + sStackY_e00.n[1];
      sStackY_e60.n[2] = sStackY_e60.n[2] + sStackY_e00.n[2];
      sStackY_e60.n[3] = sStackY_e60.n[3] + sStackY_e00.n[3];
      sStackY_e60.n[4] = sStackY_e60.n[4] + sStackY_e00.n[4];
      sStackY_e60.normalized = 0;
      sStackY_e60.magnitude = sStackY_e00.magnitude + sStackY_e60.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x1238bd;
      secp256k1_fe_verify(&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x1238c5;
      iVar2 = secp256k1_fe_is_square_var(&sStackY_e60);
      if (iVar2 == 0) {
        return;
      }
      a_01 = &sStackY_d70;
      psStackY_e78 = (secp256k1_fe *)0x1238e5;
      secp256k1_fe_sqr(a_01,&sStackY_dd0);
      psVar16 = &sStackY_d10;
      a_00 = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x1238fd;
      secp256k1_fe_mul(psVar16,a_00,a_01);
      psStackY_e78 = (secp256k1_fe *)0x123905;
      secp256k1_fe_verify(psVar16);
      if (10 < sStackY_d10.magnitude) goto LAB_00123ea5;
      sStackY_d10.n[0] = sStackY_d10.n[0] * 3;
      sStackY_d10.n[1] = sStackY_d10.n[1] * 3;
      sStackY_d10.n[2] = sStackY_d10.n[2] * 3;
      sStackY_d10.n[3] = sStackY_d10.n[3] * 3;
      sStackY_d10.n[4] = sStackY_d10.n[4] * 3;
      sStackY_d10.normalized = 0;
      sStackY_d10.magnitude = sStackY_d10.magnitude * 3;
      psStackY_e78 = (secp256k1_fe *)0x123966;
      secp256k1_fe_verify(&sStackY_d10);
      a_01 = &sStackY_d70;
      psStackY_e78 = (secp256k1_fe *)0x123981;
      a_00 = a_01;
      secp256k1_fe_mul(a_01,a_01,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x123989;
      psVar16 = a_01;
      secp256k1_fe_verify(a_01);
      if (8 < sStackY_d70.magnitude) goto LAB_00123eaa;
      psVar16 = &sStackY_d70;
      sStackY_d70.n[0] = sStackY_d70.n[0] << 2;
      sStackY_d70.n[1] = sStackY_d70.n[1] << 2;
      sStackY_d70.n[2] = sStackY_d70.n[2] << 2;
      sStackY_d70.n[3] = sStackY_d70.n[3] << 2;
      sStackY_d70.n[4] = sStackY_d70.n[4] << 2;
      sStackY_d70.magnitude = sStackY_d70.magnitude << 2;
      a_01 = (secp256k1_fe *)0x0;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x1239d9;
      secp256k1_fe_verify(psVar16);
      psStackY_e78 = (secp256k1_fe *)0x1239e1;
      secp256k1_fe_verify(psVar16);
      sStackY_d70.n[0] = sStackY_d70.n[0] + 0x1c;
      sStackY_d70.magnitude = sStackY_d70.magnitude + 1;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x1239f5;
      secp256k1_fe_verify(psVar16);
      psStackY_e78 = (secp256k1_fe *)0x123a05;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x123a0d;
      secp256k1_fe_verify(psVar16);
      if (0x20 < sStackY_d70.magnitude + sStackY_d10.magnitude) goto LAB_00123eaf;
      sStackY_d10.n[0] = sStackY_d10.n[0] + sStackY_d70.n[0];
      sStackY_d10.n[1] = sStackY_d10.n[1] + sStackY_d70.n[1];
      sStackY_d10.n[2] = sStackY_d10.n[2] + sStackY_d70.n[2];
      sStackY_d10.n[3] = sStackY_d10.n[3] + sStackY_d70.n[3];
      sStackY_d10.n[4] =
           (long)(((secp256k1_ecmult_gen_context *)sStackY_d10.n[4])->scalar_offset).d +
           (sStackY_d70.n[4] - 8);
      sStackY_d10.normalized = 0;
      sStackY_d10.magnitude = sStackY_d70.magnitude + sStackY_d10.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x123a6f;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x123a7f;
      secp256k1_fe_mul(&sStackY_d10,&sStackY_d10,&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x123a87;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x123a94;
      secp256k1_fe_verify_magnitude(&sStackY_d10,1);
      sStackY_d10.n[0] = 0x3ffffbfffff0bc - sStackY_d10.n[0];
      sStackY_d10.n[1] = 0x3ffffffffffffc - sStackY_d10.n[1];
      sStackY_d10.n[2] = 0x3ffffffffffffc - sStackY_d10.n[2];
      sStackY_d10.n[3] = 0x3ffffffffffffc - sStackY_d10.n[3];
      psVar11 = (secp256k1_context *)(0x3fffffffffffc - sStackY_d10.n[4]);
      sStackY_d10.magnitude = 2;
      sStackY_d10.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x123ad2;
      sStackY_d10.n[4] = (uint64_t)psVar11;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x123ada;
      iVar2 = secp256k1_fe_is_square_var(&sStackY_d10);
      if (iVar2 == 0) {
        return;
      }
      psVar16 = &sStackY_d40;
      a_00 = &sStackY_d10;
      psStackY_e78 = (secp256k1_fe *)0x123af7;
      iVar2 = secp256k1_fe_sqrt(psVar16,a_00);
      psVar9 = psStackY_e68;
      if (iVar2 == 0) goto LAB_00123ebe;
      psVar11 = (secp256k1_context *)0xffffefffffc2f;
      if ((uVar6 & 1) != 0) {
        psStackY_e78 = (secp256k1_fe *)0x123b28;
        secp256k1_fe_verify(&sStackY_d40);
        uVar5 = (sStackY_d40.n[4] >> 0x30) * 0x1000003d1 + sStackY_d40.n[0];
        if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
          uVar10 = (uVar5 >> 0x34) + sStackY_d40.n[1];
          uVar13 = (uVar10 >> 0x34) + sStackY_d40.n[2];
          uVar15 = (uVar13 >> 0x34) + sStackY_d40.n[3];
          uVar17 = (uVar15 >> 0x34) + (sStackY_d40.n[4] & 0xffffffffffff);
          if (((uVar10 | uVar5 | uVar13 | uVar15) & 0xfffffffffffff) == 0 && uVar17 == 0) {
            return;
          }
          if ((uVar5 + 0x1000003d0 & uVar10 & uVar13 & uVar15 & (uVar17 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
      }
      psStackY_e78 = (secp256k1_fe *)0x123bf3;
      secp256k1_fe_verify(&sStackY_e60);
      uVar5 = (sStackY_e60.n[4] >> 0x30) * 0x1000003d1 + sStackY_e60.n[0];
      if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar5 >> 0x34) + sStackY_e60.n[1];
        uVar13 = (uVar10 >> 0x34) + sStackY_e60.n[2];
        uVar15 = (uVar13 >> 0x34) + sStackY_e60.n[3];
        uVar17 = (uVar15 >> 0x34) + (sStackY_e60.n[4] & 0xffffffffffff);
        if (((uVar10 | uVar5 | uVar13 | uVar15) & 0xfffffffffffff) == 0 && uVar17 == 0) {
          return;
        }
        if ((uVar5 + 0x1000003d0 & uVar10 & uVar13 & uVar15 & (uVar17 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_01 = &sStackY_da0;
      psStackY_e78 = (secp256k1_fe *)0x123caf;
      secp256k1_fe_inv_var(a_01,&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x123cc2;
      a_00 = a_01;
      secp256k1_fe_mul(a_01,a_01,&sStackY_d40);
      psStackY_e78 = (secp256k1_fe *)0x123cca;
      secp256k1_fe_verify(a_01);
      psVar16 = &sStackY_e30;
      psStackY_e78 = (secp256k1_fe *)0x123cd7;
      secp256k1_fe_verify(psVar16);
      if (sStackY_e30.magnitude + sStackY_da0.magnitude < 0x21) {
        a_01 = &sStackY_da0;
        sStackY_da0.n[0] = sStackY_da0.n[0] + sStackY_e30.n[0];
        sStackY_da0.n[1] = sStackY_da0.n[1] + sStackY_e30.n[1];
        sStackY_da0.n[2] = sStackY_da0.n[2] + sStackY_e30.n[2];
        sStackY_da0.n[3] = sStackY_da0.n[3] + sStackY_e30.n[3];
        sStackY_da0.n[4] = sStackY_da0.n[4] + sStackY_e30.n[4];
        sStackY_da0.normalized = 0;
        sStackY_da0.magnitude = sStackY_e30.magnitude + sStackY_da0.magnitude;
        psStackY_e78 = (secp256k1_fe *)0x123d2f;
        secp256k1_fe_verify(a_01);
        psStackY_e78 = (secp256k1_fe *)0x123d37;
        secp256k1_fe_half(a_01);
        goto LAB_00123d37;
      }
      goto LAB_00123ec3;
    }
    a_01 = &sStackY_e30;
    sStackY_e30.n[4] = sStackY_e00.n[4];
    sStackY_e30.magnitude = sStackY_e00.magnitude;
    sStackY_e30.normalized = sStackY_e00.normalized;
    sStackY_e30.n[2] = sStackY_e00.n[2];
    sStackY_e30.n[3] = sStackY_e00.n[3];
    sStackY_e30.n[0] = sStackY_e00.n[0];
    sStackY_e30.n[1] = sStackY_e00.n[1];
    psStackY_e78 = (secp256k1_fe *)0x12346c;
    secp256k1_fe_verify(a_01);
    psVar16 = &sStackY_dd0;
    psStackY_e78 = (secp256k1_fe *)0x12347c;
    secp256k1_fe_verify(psVar16);
    if (0x20 < sStackY_dd0.magnitude + sStackY_e30.magnitude) goto LAB_00123e9b;
    sStackY_e30.n[0] = sStackY_e30.n[0] + sStackY_dd0.n[0];
    sStackY_e30.n[1] = sStackY_e30.n[1] + sStackY_dd0.n[1];
    sStackY_e30.n[2] = (long)(uint64_t *)sStackY_dd0.n[2] + sStackY_e30.n[2];
    sStackY_e30.n[3] = sStackY_e30.n[3] + sStackY_dd0.n[3];
    sStackY_e30.n[4] = sStackY_e30.n[4] + sStackY_dd0.n[4];
    sStackY_e30.normalized = 0;
    sStackY_e30.magnitude = sStackY_dd0.magnitude + sStackY_e30.magnitude;
    psStackY_e78 = (secp256k1_fe *)0x1234da;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x1234e2;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x1234ef;
    secp256k1_fe_verify_magnitude(&sStackY_e30,2);
    sStackY_e30.n[0] = 0x5ffff9ffffe91a - sStackY_e30.n[0];
    sStackY_e30.n[1] = 0x5ffffffffffffa - sStackY_e30.n[1];
    sStackY_e30.n[2] = 0x5ffffffffffffa - sStackY_e30.n[2];
    sStackY_e30.n[3] = 0x5ffffffffffffa - sStackY_e30.n[3];
    sStackY_e30.n[4] = 0x5fffffffffffa - sStackY_e30.n[4];
    sStackY_e30.magnitude = 3;
    sStackY_e30.normalized = 0;
    psStackY_e78 = (secp256k1_fe *)0x123537;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x12353f;
    iVar2 = secp256k1_ge_x_on_curve_var(&sStackY_e30);
    psVar11 = psStackY_e68;
    a_01 = (secp256k1_fe *)0x0;
    if (iVar2 != 0) {
      return;
    }
    psVar16 = &sStackY_e30;
    psStackY_e78 = (secp256k1_fe *)0x123564;
    secp256k1_fe_sqr(&sStackY_e60,psVar16);
    psStackY_e78 = (secp256k1_fe *)0x12356c;
    secp256k1_fe_verify(&sStackY_e60);
    psStackY_e78 = (secp256k1_fe *)0x123579;
    secp256k1_fe_verify_magnitude(&sStackY_e60,1);
    sStackY_e60.n[0] = 0x3ffffbfffff0bc - sStackY_e60.n[0];
    sStackY_e60.n[1] = 0x3ffffffffffffc - sStackY_e60.n[1];
    sStackY_e60.n[2] = 0x3ffffffffffffc - sStackY_e60.n[2];
    sStackY_e60.n[3] = 0x3ffffffffffffc - sStackY_e60.n[3];
    sStackY_e60.n[4] = 0x3fffffffffffc - sStackY_e60.n[4];
    sStackY_e60.magnitude = 2;
    sStackY_e60.normalized = 0;
    psStackY_e78 = (secp256k1_fe *)0x1235c1;
    secp256k1_fe_verify(&sStackY_e60);
    a_00 = &sStackY_dd0;
    psStackY_e78 = (secp256k1_fe *)0x1235d6;
    secp256k1_fe_mul(psVar16,a_00,&sStackY_e00);
    psStackY_e78 = (secp256k1_fe *)0x1235de;
    secp256k1_fe_verify(&sStackY_e60);
    psStackY_e78 = (secp256k1_fe *)0x1235e6;
    secp256k1_fe_verify(psVar16);
    if (sStackY_e30.magnitude + sStackY_e60.magnitude < 0x21) {
      sStackY_e60.n[0] = sStackY_e60.n[0] + sStackY_e30.n[0];
      sStackY_e60.n[1] = sStackY_e60.n[1] + sStackY_e30.n[1];
      sStackY_e60.n[2] = sStackY_e60.n[2] + sStackY_e30.n[2];
      sStackY_e60.n[3] = sStackY_e60.n[3] + sStackY_e30.n[3];
      sStackY_e60.n[4] = sStackY_e60.n[4] + sStackY_e30.n[4];
      sStackY_e60.normalized = 0;
      sStackY_e60.magnitude = sStackY_e30.magnitude + sStackY_e60.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x12363c;
      secp256k1_fe_verify(&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x123644;
      secp256k1_fe_verify(&sStackY_e60);
      uVar5 = (sStackY_e60.n[4] >> 0x30) * 0x1000003d1 + sStackY_e60.n[0];
      if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar5 >> 0x34) + sStackY_e60.n[1];
        a_00 = (secp256k1_fe *)((uVar10 >> 0x34) + sStackY_e60.n[2]);
        psVar16 = (secp256k1_fe *)(((ulong)a_00 >> 0x34) + sStackY_e60.n[3]);
        uVar13 = ((ulong)psVar16 >> 0x34) + (sStackY_e60.n[4] & 0xffffffffffff);
        if ((((uVar10 | uVar5 | (ulong)a_00 | (ulong)psVar16) & 0xfffffffffffff) == 0 && uVar13 == 0
            ) || ((uVar5 + 0x1000003d0 & uVar10 & (ulong)a_00 & (ulong)psVar16 &
                  (uVar13 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00123ecd;
      }
      psStackY_e78 = (secp256k1_fe *)0x123710;
      secp256k1_fe_sqr(&sStackY_d70,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x12371e;
      secp256k1_fe_mul(&sStackY_d70,&sStackY_d70,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x123726;
      secp256k1_fe_verify(&sStackY_d70);
      sStackY_d70.n[0] = sStackY_d70.n[0] + 7;
      sStackY_d70.magnitude = sStackY_d70.magnitude + 1;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x12373e;
      secp256k1_fe_verify(&sStackY_d70);
      psStackY_e78 = (secp256k1_fe *)0x123753;
      secp256k1_fe_mul(&sStackY_e30,&sStackY_e60,&sStackY_d70);
      psStackY_e78 = (secp256k1_fe *)0x12375b;
      iVar2 = secp256k1_fe_is_square_var(&sStackY_e30);
      if (iVar2 == 0) {
        return;
      }
      a_01 = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x123776;
      secp256k1_fe_inv_var(a_01,a_01);
      psStackY_e78 = (secp256k1_fe *)0x123789;
      secp256k1_fe_mul(a_01,a_01,&sStackY_d70);
      sStackY_da0.n[4] = sStackY_e00.n[4];
      sStackY_da0.magnitude = sStackY_e00.magnitude;
      sStackY_da0.normalized = sStackY_e00.normalized;
      sStackY_da0.n[2] = sStackY_e00.n[2];
      sStackY_da0.n[3] = sStackY_e00.n[3];
      sStackY_da0.n[0] = sStackY_e00.n[0];
      sStackY_da0.n[1] = sStackY_e00.n[1];
      psVar9 = psVar11;
LAB_00123d37:
      psVar16 = &sStackY_e30;
      a_00 = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x123d46;
      iVar2 = secp256k1_fe_sqrt(psVar16,a_00);
      if (iVar2 == 0) goto LAB_00123eb4;
      if (((uVar6 & 5) == 5) || ((uVar6 & 5) == 0)) {
        psStackY_e78 = (secp256k1_fe *)0x123d6a;
        secp256k1_fe_verify(&sStackY_e30);
        psStackY_e78 = (secp256k1_fe *)0x123d77;
        secp256k1_fe_verify_magnitude(&sStackY_e30,1);
        sStackY_e30.n[0] = 0x3ffffbfffff0bc - sStackY_e30.n[0];
        sStackY_e30.n[1] = 0x3ffffffffffffc - sStackY_e30.n[1];
        sStackY_e30.n[2] = 0x3ffffffffffffc - sStackY_e30.n[2];
        sStackY_e30.n[3] = 0x3ffffffffffffc - sStackY_e30.n[3];
        sStackY_e30.n[4] = 0x3fffffffffffc - sStackY_e30.n[4];
        sStackY_e30.magnitude = 2;
        sStackY_e30.normalized = 0;
        psStackY_e78 = (secp256k1_fe *)0x123dbf;
        secp256k1_fe_verify(&sStackY_e30);
      }
      psVar16 = &secp256k1_ellswift_c4;
      if ((uVar6 & 1) == 0) {
        psVar16 = &secp256k1_ellswift_c3;
      }
      a_01 = &sStackY_dd0;
      psStackY_e78 = (secp256k1_fe *)0x123de8;
      a_00 = a_01;
      secp256k1_fe_mul(a_01,a_01,psVar16);
      psStackY_e78 = (secp256k1_fe *)0x123df0;
      secp256k1_fe_verify(a_01);
      psVar16 = &sStackY_da0;
      psStackY_e78 = (secp256k1_fe *)0x123e00;
      secp256k1_fe_verify(psVar16);
      if (sStackY_da0.magnitude + sStackY_dd0.magnitude < 0x21) {
        sStackY_dd0.n[0] = sStackY_dd0.n[0] + sStackY_da0.n[0];
        sStackY_dd0.n[1] = sStackY_dd0.n[1] + sStackY_da0.n[1];
        sStackY_dd0.n[2] = (long)(uint64_t *)sStackY_dd0.n[2] + sStackY_da0.n[2];
        sStackY_dd0.n[3] = sStackY_dd0.n[3] + sStackY_da0.n[3];
        sStackY_dd0.n[4] = sStackY_dd0.n[4] + sStackY_da0.n[4];
        sStackY_dd0.normalized = 0;
        sStackY_dd0.magnitude = sStackY_da0.magnitude + sStackY_dd0.magnitude;
        psStackY_e78 = (secp256k1_fe *)0x123e61;
        secp256k1_fe_verify(&sStackY_dd0);
        psStackY_e78 = (secp256k1_fe *)0x123e71;
        secp256k1_fe_mul((secp256k1_fe *)psVar9,&sStackY_e30,&sStackY_dd0);
        return;
      }
      goto LAB_00123eb9;
    }
  }
  psStackY_e78 = (secp256k1_fe *)0x123ecd;
  secp256k1_ellswift_xswiftec_inv_var_cold_10();
LAB_00123ecd:
  psStackY_e78 = (secp256k1_fe *)fe_equal;
  secp256k1_ellswift_xswiftec_inv_var_cold_7();
  sStackY_eb8.n[0] = psVar16->n[0];
  sStackY_eb8.n[1] = psVar16->n[1];
  sStackY_eb8.n[2] = psVar16->n[2];
  sStackY_eb8.n[3] = psVar16->n[3];
  sStackY_eb8.n[4] = psVar16->n[4];
  sStackY_eb8.magnitude = psVar16->magnitude;
  sStackY_eb8.normalized = psVar16->normalized;
  sStackY_ee8.n[0] = a_00->n[0];
  sStackY_ee8.n[1] = a_00->n[1];
  sStackY_ee8.n[2] = a_00->n[2];
  sStackY_ee8.n[3] = a_00->n[3];
  sStackY_ee8.n[4] = a_00->n[4];
  sStackY_ee8.magnitude = a_00->magnitude;
  sStackY_ee8.normalized = a_00->normalized;
  psStackY_e80 = psVar11;
  psStackY_e78 = a_01;
  secp256k1_fe_verify(&sStackY_eb8);
  uVar10 = (sStackY_eb8.n[4] >> 0x30) * 0x1000003d1 + sStackY_eb8.n[0];
  uVar5 = (uVar10 >> 0x34) + sStackY_eb8.n[1];
  uVar13 = (uVar5 >> 0x34) + sStackY_eb8.n[2];
  uVar15 = (uVar13 >> 0x34) + sStackY_eb8.n[3];
  sStackY_eb8.n[3] = uVar15 & 0xfffffffffffff;
  sStackY_eb8.n[4] = (uVar15 >> 0x34) + (sStackY_eb8.n[4] & 0xffffffffffff);
  sStackY_eb8.n[2] = uVar13 & 0xfffffffffffff;
  sStackY_eb8.n[1] = uVar5 & 0xfffffffffffff;
  sStackY_eb8.n[0] = uVar10 & 0xfffffffffffff;
  sStackY_eb8.magnitude = 1;
  secp256k1_fe_verify(&sStackY_eb8);
  secp256k1_fe_equal(&sStackY_eb8,&sStackY_ee8);
  return;
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        testutil_random_ge_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        CHECK(secp256k1_ge_eq_var(&g, &g2));
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) testrand256_test(auxrnd32);
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        CHECK(secp256k1_gej_eq_ge_var(&res, &dec));
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        testrand256_test(ell64);
        testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        SECP256K1_FE_VERIFY(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            testrand256_test(prefix64);
            testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        testrand256_test(auxrnd32a);
        testrand256_test(auxrnd32b);
        testutil_random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        testutil_random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'e', 'n', 'c', 'o', 'd', 'e'};
        static const unsigned char create_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'c', 'r', 'e', 'a', 't', 'e'};
        static const unsigned char bip324_tag[] = {'b', 'i', 'p', '3', '2', '4', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'x', 'o', 'n', 'l', 'y', '_', 'e', 'c', 'd', 'h'};

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}